

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

string * __thiscall
cmComputeLinkInformation::NoCaseExpression
          (string *__return_storage_ptr__,cmComputeLinkInformation *this,string *str)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_50;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *str_local;
  cmComputeLinkInformation *this_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_50._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb0), bVar2) {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar4;
    if (cVar1 == '.') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'[');
      iVar3 = tolower((int)cVar1);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar3);
      iVar3 = toupper((int)cVar1);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar3);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,']');
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::NoCaseExpression(std::string const& str)
{
  std::string ret;
  ret.reserve(str.size() * 4);
  for (char c : str) {
    if (c == '.') {
      ret += c;
    } else {
      ret += '[';
      ret += static_cast<char>(tolower(c));
      ret += static_cast<char>(toupper(c));
      ret += ']';
    }
  }
  return ret;
}